

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofR.cpp
# Opt level: O0

void __thiscall OpenMD::GofR::preProcess(GofR *this)

{
  iterator __first;
  iterator __last;
  vector<double,_std::allocator<double>_> *in_RDI;
  double *in_stack_ffffffffffffffb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffc0;
  
  std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __first = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  __last = std::vector<double,_std::allocator<double>_>::end(in_RDI);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current,(double *)0x0);
  return;
}

Assistant:

void GofR::preProcess() {
    std::fill(avgGofr_.begin(), avgGofr_.end(), 0.0);
    std::fill(sumGofr1_.begin(), sumGofr1_.end(), 0.0);
    std::fill(sumGofr2_.begin(), sumGofr2_.end(), 0.0);
  }